

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O2

void __thiscall FontInfo::writeToTextFile(FontInfo *this,string *fileName)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  pointer pKVar8;
  ostream *poVar9;
  uint8_t charSet;
  long lVar10;
  FontInfo *pFVar11;
  size_t i;
  ulong uVar12;
  pointer pCVar13;
  pointer pKVar14;
  allocator local_269;
  FontInfo *local_268;
  int local_260;
  int local_25c;
  pointer local_258;
  string local_250;
  ofstream f;
  uint auStack_218 [122];
  
  std::ofstream::ofstream((ostream *)&f,(string *)fileName,_S_out);
  poVar9 = std::operator<<((ostream *)&f,"info");
  poVar9 = std::operator<<(poVar9," face=\"");
  poVar9 = std::operator<<(poVar9,(string *)&(this->info).face);
  poVar9 = std::operator<<(poVar9,"\"");
  poVar9 = std::operator<<(poVar9," size=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->info).size);
  poVar9 = std::operator<<(poVar9," bold=");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  poVar9 = std::operator<<(poVar9," italic=");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  poVar9 = std::operator<<(poVar9," charset=\"");
  if ((this->info).unicode == true) {
    std::__cxx11::string::string((string *)&local_250,"",&local_269);
  }
  else {
    getCharSetName_abi_cxx11_(&local_250,(FontInfo *)(ulong)(this->info).charset,charSet);
  }
  poVar9 = std::operator<<(poVar9,(string *)&local_250);
  poVar9 = std::operator<<(poVar9,"\"");
  poVar9 = std::operator<<(poVar9," unicode=");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  poVar9 = std::operator<<(poVar9," stretchH=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->info).stretchH);
  poVar9 = std::operator<<(poVar9," smooth=");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  poVar9 = std::operator<<(poVar9," aa=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).aa);
  poVar9 = std::operator<<(poVar9," padding=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.up);
  poVar9 = std::operator<<(poVar9,",");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.right);
  poVar9 = std::operator<<(poVar9,",");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.down);
  poVar9 = std::operator<<(poVar9,",");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.left);
  poVar9 = std::operator<<(poVar9," spacing=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).spacing.horizontal);
  poVar9 = std::operator<<(poVar9,",");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).spacing.vertical);
  poVar9 = std::operator<<(poVar9," outline=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).outline);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::__cxx11::string::~string((string *)&local_250);
  poVar9 = std::operator<<((ostream *)&f,"common");
  poVar9 = std::operator<<(poVar9," lineHeight=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->common).lineHeight);
  poVar9 = std::operator<<(poVar9," base=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->common).base);
  poVar9 = std::operator<<(poVar9," scaleW=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->common).scaleW);
  poVar9 = std::operator<<(poVar9," scaleH=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->common).scaleH);
  poVar9 = std::operator<<(poVar9," pages=");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9," packed=");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  poVar9 = std::operator<<(poVar9," alphaChnl=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).alphaChnl);
  poVar9 = std::operator<<(poVar9," redChnl=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).redChnl);
  poVar9 = std::operator<<(poVar9," greenChnl=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).greenChnl);
  poVar9 = std::operator<<(poVar9," blueChnl=");
  std::ostream::operator<<(poVar9,(uint)(this->common).blueChnl);
  if (this->extraInfo == true) {
    poVar9 = std::operator<<((ostream *)&f," totalHeight=");
    std::ostream::operator<<(poVar9,(this->common).totalHeight);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  lVar10 = 0;
  local_268 = this;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)(local_268->pages).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_268->pages).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1) {
    poVar9 = std::operator<<((ostream *)&f,"page id=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," file=\"");
    poVar9 = std::operator<<(poVar9,(string *)
                                    ((long)&(((local_268->pages).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar10));
    poVar9 = std::operator<<(poVar9,"\"");
    std::endl<char,std::char_traits<char>>(poVar9);
    lVar10 = lVar10 + 0x20;
  }
  poVar9 = std::operator<<((ostream *)&f,"chars count=");
  pFVar11 = local_268;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::endl<char,std::char_traits<char>>(poVar9);
  *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) & 0xffffff4f | 0x20;
  local_258 = (pFVar11->chars).super__Vector_base<FontInfo::Char,_std::allocator<FontInfo::Char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pCVar13 = (pFVar11->chars).super__Vector_base<FontInfo::Char,_std::allocator<FontInfo::Char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (; pCVar13 != local_258; pCVar13 = pCVar13 + 1) {
    uVar1 = pCVar13->x;
    uVar2 = pCVar13->y;
    uVar3 = pCVar13->width;
    uVar4 = pCVar13->height;
    sVar5 = pCVar13->xoffset;
    sVar6 = pCVar13->yoffset;
    sVar7 = pCVar13->xadvance;
    local_25c = (int)pCVar13->page;
    local_260 = (int)pCVar13->chnl;
    poVar9 = std::operator<<((ostream *)&f,"char");
    poVar9 = std::operator<<(poVar9," id=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 4;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," x=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar1);
    poVar9 = std::operator<<(poVar9," y=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
    poVar9 = std::operator<<(poVar9," width=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar3);
    poVar9 = std::operator<<(poVar9," height=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar4);
    poVar9 = std::operator<<(poVar9," xoffset=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar5);
    poVar9 = std::operator<<(poVar9," yoffset=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar6);
    poVar9 = std::operator<<(poVar9," xadvance=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar7);
    poVar9 = std::operator<<(poVar9," page=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_25c);
    poVar9 = std::operator<<(poVar9," chnl=");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_260);
    std::endl<char,std::char_traits<char>>(poVar9);
    pFVar11 = local_268;
  }
  *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) & 0xffffff4f | 0x80;
  if ((pFVar11->kernings).super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pFVar11->kernings).super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar9 = std::operator<<((ostream *)&f,"kernings count=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    pKVar8 = (pFVar11->kernings).
             super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pKVar14 = (pFVar11->kernings).
                   super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>._M_impl
                   .super__Vector_impl_data._M_start; pKVar14 != pKVar8; pKVar14 = pKVar14 + 1) {
      sVar5 = pKVar14->amount;
      poVar9 = std::operator<<((ostream *)&f,"kerning ");
      poVar9 = std::operator<<(poVar9,"first=");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," second=");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," amount=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar5);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void FontInfo::writeToTextFile(const std::string &fileName) const
{
    std::ofstream f(fileName);

    f << "info"
        << " face=\"" << info.face << "\""
        << " size=" << info.size
        << " bold=" << info.bold
        << " italic=" << info.italic
        << " charset=\"" << (info.unicode ? "" : getCharSetName(info.charset)) << "\""
        << " unicode=" << info.unicode
        << " stretchH=" << info.stretchH
        << " smooth=" << info.smooth
        << " aa=" << static_cast<int>(info.aa)
        << " padding="
           << static_cast<int>(info.padding.up)
           << "," << static_cast<int>(info.padding.right)
           << "," << static_cast<int>(info.padding.down)
           << "," << static_cast<int>(info.padding.left)
        << " spacing="
            << static_cast<int>(info.spacing.horizontal)
            << "," << static_cast<int>(info.spacing.vertical)
        << " outline=" << static_cast<int>(info.outline)
        << std::endl;

    f << "common"
        << " lineHeight=" << common.lineHeight
        << " base=" << common.base
        << " scaleW=" << common.scaleW
        << " scaleH=" << common.scaleH
        << " pages=" << pages.size()
        << " packed=" << common.packed
        << " alphaChnl=" << static_cast<int>(common.alphaChnl)
        << " redChnl=" << static_cast<int>(common.redChnl)
        << " greenChnl=" << static_cast<int>(common.greenChnl)
        << " blueChnl=" << static_cast<int>(common.blueChnl);
    if (extraInfo)
        f << " totalHeight=" << common.totalHeight;
    f << std::endl;

    for (size_t i = 0; i < pages.size(); ++i)
        f << "page id=" << i << " file=\"" << pages[i] << "\"" << std::endl;

    f << "chars count=" << chars.size() << std::endl;
    f << std::left;
    for(auto c: chars)
    {
        f << "char"
            << " id=" <<  std::setw(4) << c.id
            << " x=" << std::setw(5) << c.x
            << " y=" << std::setw(5) << c.y
            << " width=" << std::setw(5) << c.width
            << " height=" << std::setw(5) << c.height
            << " xoffset=" << std::setw(5) << c.xoffset
            << " yoffset=" << std::setw(5) << c.yoffset
            << " xadvance=" << std::setw(5) << c.xadvance
            << " page=" << std::setw(2) << static_cast<int>(c.page)
            << " chnl=" << std::setw(2) << static_cast<int>(c.chnl)
            << std::endl;
    }
    f << std::right;
    if (!kernings.empty())
    {
        f << "kernings count=" << kernings.size() << std::endl;
        for(auto k: kernings)
        {
            f << "kerning "
              << "first=" << k.first
              << " second=" << k.second
              << " amount=" << k.amount
              << std::endl;
        }
    }
}